

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hiredis.c
# Opt level: O0

int redisBufferWrite(redisContext *c,int *done)

{
  int start;
  size_t sVar1;
  sds pcVar2;
  int nwritten;
  int *done_local;
  redisContext *c_local;
  
  if (c->err == 0) {
    sVar1 = sdslen(c->obuf);
    if (sVar1 != 0) {
      start = (*c->funcs->write)(c);
      if (start < 0) {
        return -1;
      }
      if (0 < start) {
        sVar1 = sdslen(c->obuf);
        if (start == (int)sVar1) {
          sdsfree(c->obuf);
          pcVar2 = sdsempty();
          c->obuf = pcVar2;
        }
        else {
          sdsrange(c->obuf,start,-1);
        }
      }
    }
    if (done != (int *)0x0) {
      sVar1 = sdslen(c->obuf);
      *done = (uint)(sVar1 == 0);
    }
    c_local._4_4_ = 0;
  }
  else {
    c_local._4_4_ = -1;
  }
  return c_local._4_4_;
}

Assistant:

int redisBufferWrite(redisContext *c, int *done) {

    /* Return early when the context has seen an error. */
    if (c->err)
        return REDIS_ERR;

    if (sdslen(c->obuf) > 0) {
        int nwritten = c->funcs->write(c);
        if (nwritten < 0) {
            return REDIS_ERR;
        } else if (nwritten > 0) {
            if (nwritten == (signed)sdslen(c->obuf)) {
                sdsfree(c->obuf);
                c->obuf = sdsempty();
            } else {
                sdsrange(c->obuf,nwritten,-1);
            }
        }
    }
    if (done != NULL) *done = (sdslen(c->obuf) == 0);
    return REDIS_OK;
}